

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

ptrdiff_t __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::reMax
          (ClassArray<soplex::Nonzero<double>_> *this,int newMax,int newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  int *piVar5;
  uint n;
  long lVar6;
  ptrdiff_t pVar7;
  Nonzero<double> *newMem;
  Nonzero<double> *local_28;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    pVar7 = 0;
  }
  else {
    local_28 = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&local_28,n);
    uVar4 = 0;
    if ((0 < newSize) && (0 < this->thesize)) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        puVar1 = (undefined8 *)((long)&this->data->val + lVar6);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&local_28->val + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar4 = uVar4 + 1;
        if ((uint)newSize <= uVar4) break;
        lVar6 = lVar6 + 0x10;
      } while ((long)uVar4 < (long)this->thesize);
    }
    if ((uint)uVar4 < n) {
      lVar6 = (ulong)n - (uVar4 & 0xffffffff);
      piVar5 = &local_28[uVar4 & 0xffffffff].idx;
      do {
        ((Nonzero<double> *)(piVar5 + -2))->val = 0.0;
        *piVar5 = 0;
        piVar5 = piVar5 + 4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    pVar7 = (long)local_28 - (long)this->data;
    free(this->data);
    this->data = (Nonzero<double> *)0x0;
    this->data = local_28;
    this->themax = n;
    this->thesize = newSize;
  }
  return pVar7;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }